

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

bool __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::RowIsValid
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx)

{
  _func_int **pp_Var1;
  bool bVar2;
  ulong uVar3;
  idx_t row_idx_00;
  TemplatedValidityMask<unsigned_long> *this_00;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  this_00 = &this->vdata[0].validity.super_TemplatedValidityMask<unsigned_long>;
  do {
    uVar3 = ((long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x68;
    uVar4 = uVar4 + 1;
    if (uVar3 <= uVar4) break;
    pp_Var1 = (this_00[-1].validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    row_idx_00 = row_idx;
    if (pp_Var1 != (_func_int **)0x0) {
      row_idx_00 = (idx_t)*(uint *)((long)pp_Var1 + row_idx * 4);
    }
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,row_idx_00);
    this_00 = (TemplatedValidityMask<unsigned_long> *)&this_00[2].validity_data;
  } while (bVar2);
  return uVar3 <= uVar4;
}

Assistant:

bool RowIsValid(idx_t row_idx) {
		for (idx_t i = 0; i < args.ColumnCount(); i++) {
			auto idx = vdata[i].sel->get_index(row_idx);
			if (!vdata[i].validity.RowIsValid(idx)) {
				return false;
			}
		}
		return true;
	}